

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O2

void soul::CallFlowGraph::calculateLocalVariableStackSize(Function *f)

{
  int iVar1;
  undefined4 extraout_var;
  uint64_t uVar2;
  uint64_t uVar3;
  pool_ref<soul::heart::Variable> *v;
  pointer ppVar4;
  _Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  local_38;
  
  if (f->localVariableStackSize == 0) {
    heart::Function::getAllLocalVariables
              ((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                *)&local_38,f);
    uVar3 = 0;
    for (ppVar4 = local_38._M_impl.super__Vector_impl_data._M_start;
        ppVar4 != local_38._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
      iVar1 = (*(ppVar4->object->super_Expression).super_Object._vptr_Object[2])();
      uVar2 = Type::getPackedSizeInBytes((Type *)CONCAT44(extraout_var,iVar1));
      uVar3 = uVar3 + (uVar2 + 7 & 0xfffffffffffffff8);
    }
    std::
    _Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
    ::~_Vector_base(&local_38);
    f->localVariableStackSize = uVar3;
  }
  return;
}

Assistant:

static void calculateLocalVariableStackSize (heart::Function& f)
    {
        if (f.localVariableStackSize == 0)
        {
            uint64_t total = 0;

            for (auto& v : f.getAllLocalVariables())
                total += getAlignedSize<stackItemAlignment> (v->getType().getPackedSizeInBytes());

            f.localVariableStackSize = total;
        }
    }